

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O1

void __thiscall FParser::OPgreaterthan(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  int iVar2;
  svalue_t right;
  svalue_t left;
  svalue_t local_60;
  svalue_t local_48;
  
  local_48.string.Chars = FString::NullString.Nothing;
  local_48.type = 1;
  local_48.value.i = 0;
  local_60.string.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_60.type = 1;
  local_60.value.i = 0;
  EvaluateExpression(this,&local_48,start,n + -1);
  EvaluateExpression(this,&local_60,n + 1,stop);
  result->type = 1;
  if ((local_48.type == 6) || (local_60.type == 6)) {
    iVar1 = fixedvalue(&local_48);
    iVar2 = fixedvalue(&local_60);
  }
  else {
    iVar1 = intvalue(&local_48);
    iVar2 = intvalue(&local_60);
  }
  *(uint *)&result->value = (uint)(iVar2 < iVar1);
  FString::~FString(&local_60.string);
  FString::~FString(&local_48.string);
  return;
}

Assistant:

void FParser::OPgreaterthan(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	// haleyjd: 8-17
	result.type = svt_int;
	if(left.type == svt_fixed || right.type == svt_fixed)
		result.value.i = (fixedvalue(left) > fixedvalue(right));
	else
		result.value.i = (intvalue(left) > intvalue(right));
}